

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

MempoolAcceptResult *
AcceptToMemoryPool(Chainstate *active_chainstate,CTransactionRef *tx,int64_t accept_time,
                  bool bypass_limits,bool test_accept)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  CChainParams *accept_time_00;
  CTxMemPool *pCVar4;
  undefined1 bypass_limits_00;
  byte bVar5;
  Chainstate *in_RDX;
  CTxMemPool *in_RSI;
  MemPoolAccept *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  COutPoint *hashTx;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range2;
  CTxMemPool *pool;
  CChainParams *chainparams;
  MempoolAcceptResult *result;
  iterator __end2;
  iterator __begin2;
  vector<COutPoint,_std::allocator<COutPoint>_> coins_to_uncache;
  ATMPArgs args;
  BlockValidationState state_dummy;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_fffffffffffffbb0;
  CCoinsViewCache *in_stack_fffffffffffffbb8;
  CCoinsViewCache *this;
  undefined4 in_stack_fffffffffffffbc8;
  MemPoolAccept *this_00;
  undefined1 in_stack_fffffffffffffc0f;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_fffffffffffffc10;
  undefined6 in_stack_fffffffffffffc28;
  ATMPArgs *in_stack_fffffffffffffce0;
  CTransactionRef *in_stack_fffffffffffffce8;
  MemPoolAccept *in_stack_fffffffffffffcf0;
  FlushStateMode in_stack_fffffffffffffe7c;
  BlockValidationState *in_stack_fffffffffffffe80;
  Chainstate *in_stack_fffffffffffffe88;
  int in_stack_ffffffffffffff74;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = (byte)in_R8D & 1;
  bVar2 = in_R9B & 1;
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
             in_stack_fffffffffffffbac,(AnnotatedMixin<std::recursive_mutex> *)0x7c9d51);
  accept_time_00 =
       ChainstateManager::GetParams
                 ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                 );
  pCVar4 = Chainstate::GetMempool
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  if (pCVar4 == (CTxMemPool *)0x0) {
    __assert_fail("active_chainstate.GetMempool() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x743,
                  "MempoolAcceptResult AcceptToMemoryPool(Chainstate &, const CTransactionRef &, int64_t, bool, bool)"
                 );
  }
  pCVar4 = Chainstate::GetMempool
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  bypass_limits_00 = (undefined1)((ulong)pCVar4 >> 0x38);
  this = (CCoinsViewCache *)&stack0xfffffffffffffc60;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  anon_unknown.dwarf_a31d20::MemPoolAccept::ATMPArgs::SingleAccept
            ((CChainParams *)CONCAT17(bVar5,CONCAT16(bVar2,in_stack_fffffffffffffc28)),
             (int64_t)accept_time_00,(bool)bypass_limits_00,in_stack_fffffffffffffc10,
             (bool)in_stack_fffffffffffffc0f);
  anon_unknown.dwarf_a31d20::MemPoolAccept::MemPoolAccept(this_00,in_RSI,in_RDX);
  anon_unknown.dwarf_a31d20::MemPoolAccept::AcceptSingleTransaction
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  anon_unknown.dwarf_a31d20::MemPoolAccept::~MemPoolAccept
            ((MemPoolAccept *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  if (*(int *)&this_00->m_pool != 0) {
    std::vector<COutPoint,_std::allocator<COutPoint>_>::begin(in_stack_fffffffffffffbb0);
    std::vector<COutPoint,_std::allocator<COutPoint>_>::end(in_stack_fffffffffffffbb0);
    while (bVar3 = __gnu_cxx::
                   operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                               *)in_stack_fffffffffffffbb8,
                              (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                               *)in_stack_fffffffffffffbb0), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
      ::operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      in_stack_fffffffffffffbb8 =
           Chainstate::CoinsTip((Chainstate *)CONCAT44(in_R8D,in_stack_fffffffffffffbc8));
      CCoinsViewCache::Uncache(this,(COutPoint *)in_stack_fffffffffffffbb8);
      __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
      ::operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    }
  }
  BlockValidationState::BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  Chainstate::FlushStateToDisk
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             in_stack_ffffffffffffff74);
  BlockValidationState::~BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffbb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (MempoolAcceptResult *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

MempoolAcceptResult AcceptToMemoryPool(Chainstate& active_chainstate, const CTransactionRef& tx,
                                       int64_t accept_time, bool bypass_limits, bool test_accept)
{
    AssertLockHeld(::cs_main);
    const CChainParams& chainparams{active_chainstate.m_chainman.GetParams()};
    assert(active_chainstate.GetMempool() != nullptr);
    CTxMemPool& pool{*active_chainstate.GetMempool()};

    std::vector<COutPoint> coins_to_uncache;
    auto args = MemPoolAccept::ATMPArgs::SingleAccept(chainparams, accept_time, bypass_limits, coins_to_uncache, test_accept);
    MempoolAcceptResult result = MemPoolAccept(pool, active_chainstate).AcceptSingleTransaction(tx, args);
    if (result.m_result_type != MempoolAcceptResult::ResultType::VALID) {
        // Remove coins that were not present in the coins cache before calling
        // AcceptSingleTransaction(); this is to prevent memory DoS in case we receive a large
        // number of invalid transactions that attempt to overrun the in-memory coins cache
        // (`CCoinsViewCache::cacheCoins`).

        for (const COutPoint& hashTx : coins_to_uncache)
            active_chainstate.CoinsTip().Uncache(hashTx);
        TRACE2(mempool, rejected,
                tx->GetHash().data(),
                result.m_state.GetRejectReason().c_str()
        );
    }
    // After we've (potentially) uncached entries, ensure our coins cache is still within its size limits
    BlockValidationState state_dummy;
    active_chainstate.FlushStateToDisk(state_dummy, FlushStateMode::PERIODIC);
    return result;
}